

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalStructuralDominance.cpp
# Opt level: O2

void wasm::LocalStructuralDominance::LocalStructuralDominance(wasm::Function*,wasm::Module&,wasm::
     LocalStructuralDominance::Mode)::Scanner::doEndScope(Scanner*,wasm::Expression___
               (Scanner *self,Expression **currp)

{
  uint uVar1;
  pointer pSVar2;
  pointer puVar3;
  IteratorBase<wasm::SmallVector<unsigned_int,_5UL>,_wasm::SmallVector<unsigned_int,_5UL>::Iterator>
  IVar4;
  ulong uVar5;
  long lVar6;
  IteratorBase<wasm::SmallVector<unsigned_int,_5UL>,_wasm::SmallVector<unsigned_int,_5UL>::Iterator>
  IVar7;
  reference rVar8;
  
  pSVar2 = (self->cleanupStack).
           super__Vector_base<wasm::SmallVector<unsigned_int,_5UL>,_std::allocator<wasm::SmallVector<unsigned_int,_5UL>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  IVar7 = (IteratorBase<wasm::SmallVector<unsigned_int,_5UL>,_wasm::SmallVector<unsigned_int,_5UL>::Iterator>
           )SmallVector<unsigned_int,_5UL>::end(pSVar2 + -1);
  lVar6 = -0x14;
  uVar5 = 0;
  while( true ) {
    IVar4.index = uVar5;
    IVar4.parent = pSVar2 + -1;
    if (IVar7 == IVar4) {
      std::
      vector<wasm::SmallVector<unsigned_int,_5UL>,_std::allocator<wasm::SmallVector<unsigned_int,_5UL>_>_>
      ::pop_back(&self->cleanupStack);
      return;
    }
    puVar3 = (pointer)&pSVar2[-1].field_0x1c;
    if (4 < uVar5) {
      puVar3 = pSVar2[-1].flexible.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
    }
    uVar1 = *(uint *)((long)puVar3 + lVar6);
    rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[](&self->localsSet,(ulong)uVar1);
    if ((*rVar8._M_p & rVar8._M_mask) == 0) break;
    rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[](&self->localsSet,(ulong)uVar1);
    *rVar8._M_p = *rVar8._M_p & ~rVar8._M_mask;
    uVar5 = uVar5 + 1;
    lVar6 = lVar6 + 4;
  }
  __assert_fail("self->localsSet[index]",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/LocalStructuralDominance.cpp"
                ,0x6f,
                "static void wasm::LocalStructuralDominance::LocalStructuralDominance(Function *, Module &, Mode)::Scanner::doEndScope(Scanner *, Expression **)"
               );
}

Assistant:

static void doEndScope(Scanner* self, Expression** currp) {
      for (auto index : self->cleanupStack.back()) {
        assert(self->localsSet[index]);
        self->localsSet[index] = false;
      }
      self->cleanupStack.pop_back();
    }